

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3gau_full_io.c
# Opt level: O0

int s3gaucnt_read_full(char *fn,vector_t ****out_wt_mean,vector_t *****out_wt_var,
                      int32 *out_pass2var,float32 ****out_dnom,uint32 *out_n_cb,uint32 *out_n_feat,
                      uint32 *out_n_density,uint32 **out_veclen)

{
  int iVar1;
  int32 iVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  float32 local_f0;
  int local_ec;
  uint32 maxveclen;
  uint32 blk;
  vector_t ****wt_var;
  vector_t ***wt_mean;
  uint32 local_d0;
  uint32 d3;
  uint32 d2;
  uint32 d1;
  uint32 l;
  uint32 k;
  uint32 j;
  uint32 b_i;
  uint32 i;
  uint32 n;
  float32 ***dnom;
  float32 *buf;
  uint32 *veclen;
  uint local_90;
  uint32 n_density;
  uint32 n_feat;
  uint32 n_cb;
  uint32 pass2var;
  uint32 has_vars;
  uint32 has_means;
  uint32 swap;
  FILE *fp;
  char *do_chk;
  char *ver;
  uint32 local_58;
  uint32 ignore;
  uint32 sv_chksum;
  uint32 rd_chksum;
  uint32 *out_n_cb_local;
  float32 ****out_dnom_local;
  int32 *out_pass2var_local;
  vector_t *****out_wt_var_local;
  vector_t ****out_wt_mean_local;
  char *fn_local;
  
  ignore = 0;
  wt_var = (vector_t ****)0x0;
  _maxveclen = (void ****)0x0;
  _sv_chksum = out_n_cb;
  out_n_cb_local = (uint32 *)out_dnom;
  out_dnom_local = (float32 ****)out_pass2var;
  out_pass2var_local = (int32 *)out_wt_var;
  out_wt_var_local = (vector_t *****)out_wt_mean;
  out_wt_mean_local = (vector_t ****)fn;
  _has_means = s3open(fn,"rb",&has_vars);
  if (_has_means == (FILE *)0x0) {
    fn_local._4_4_ = -1;
  }
  else {
    do_chk = s3get_gvn_fattr("version");
    if (do_chk == (char *)0x0) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_full_io.c"
              ,0x12f,"No version attribute for %s\n",out_wt_mean_local);
      exit(1);
    }
    iVar1 = strcmp(do_chk,"1.0");
    if (iVar1 != 0) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_full_io.c"
              ,299,"Version mismatch for %s, file ver: %s != reader ver: %s\n",out_wt_mean_local,
              do_chk,"1.0");
      exit(1);
    }
    fp = (FILE *)s3get_gvn_fattr("chksum0");
    iVar2 = bio_fread(&pass2var,4,1,_has_means,has_vars,&ignore);
    if (iVar2 == 1) {
      iVar2 = bio_fread(&n_cb,4,1,_has_means,has_vars,&ignore);
      if (iVar2 == 1) {
        iVar2 = bio_fread(&n_feat,4,1,_has_means,has_vars,&ignore);
        if (iVar2 == 1) {
          iVar2 = bio_fread(&n_density,4,1,_has_means,has_vars,&ignore);
          if (iVar2 == 1) {
            iVar2 = bio_fread((void *)((long)&veclen + 4),4,1,_has_means,has_vars,&ignore);
            if (iVar2 == 1) {
              iVar2 = bio_fread_1d(&buf,4,&local_90,_has_means,has_vars,&ignore);
              if (iVar2 < 0) {
                fn_local._4_4_ = -1;
              }
              else {
                if (pass2var != 0) {
                  iVar2 = bio_fread_1d(&dnom,4,&b_i,_has_means,has_vars,&ignore);
                  if (iVar2 < 0) {
                    return -1;
                  }
                  wt_var = (vector_t ****)
                           __ckd_calloc_3d__((ulong)n_density,(ulong)local_90,(ulong)veclen._4_4_,8,
                                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_full_io.c"
                                             ,0x152);
                  k = 0;
                  for (j = 0; j < n_density; j = j + 1) {
                    for (l = 0; l < local_90; l = l + 1) {
                      for (d1 = 0; d1 < veclen._4_4_; d1 = d1 + 1) {
                        wt_var[j][l][d1] = (vector_t *)((long)dnom + (ulong)k * 4);
                        k = (int)buf[l] + k;
                      }
                    }
                  }
                }
                if (n_cb != 0) {
                  local_ec = 0;
                  local_f0 = 0.0;
                  for (j = 0; j < local_90; j = j + 1) {
                    local_ec = (int)buf[j] + local_ec;
                    if ((uint)local_f0 < (uint)buf[j]) {
                      local_f0 = buf[j];
                    }
                  }
                  iVar2 = bio_fread_1d(&dnom,4,&b_i,_has_means,has_vars,&ignore);
                  if (iVar2 < 0) {
                    return -1;
                  }
                  if (b_i != n_density * veclen._4_4_ * local_ec * local_ec) {
                    __assert_fail("n == n_cb * n_density * blk * blk",
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_full_io.c"
                                  ,0x16a,
                                  "int s3gaucnt_read_full(const char *, vector_t ****, vector_t *****, int32 *, float32 ****, uint32 *, uint32 *, uint32 *, uint32 **)"
                                 );
                  }
                  _maxveclen = __ckd_calloc_4d__((ulong)n_density,(ulong)local_90,
                                                 (ulong)veclen._4_4_,(ulong)(uint)local_f0,8,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_full_io.c"
                                                 ,0x16d);
                  k = 0;
                  for (j = 0; j < n_density; j = j + 1) {
                    for (l = 0; l < local_90; l = l + 1) {
                      for (d1 = 0; d1 < veclen._4_4_; d1 = d1 + 1) {
                        for (d2 = 0; d2 < (uint)buf[l]; d2 = d2 + 1) {
                          *(ulong *)((long)_maxveclen[j][l][d1] + (ulong)d2 * 8) =
                               (long)dnom + (ulong)k * 4;
                          k = (int)buf[l] + k;
                        }
                      }
                    }
                  }
                }
                iVar2 = bio_fread_3d((void ****)&i,4,&d3,&local_d0,(uint32 *)((long)&wt_mean + 4),
                                     _has_means,has_vars,&ignore);
                if (iVar2 < 0) {
                  fn_local._4_4_ = -1;
                }
                else {
                  if (d3 != n_density) {
                    __assert_fail("d1 == n_cb",
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_full_io.c"
                                  ,0x180,
                                  "int s3gaucnt_read_full(const char *, vector_t ****, vector_t *****, int32 *, float32 ****, uint32 *, uint32 *, uint32 *, uint32 **)"
                                 );
                  }
                  if (local_d0 != local_90) {
                    __assert_fail("d2 == n_feat",
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_full_io.c"
                                  ,0x181,
                                  "int s3gaucnt_read_full(const char *, vector_t ****, vector_t *****, int32 *, float32 ****, uint32 *, uint32 *, uint32 *, uint32 **)"
                                 );
                  }
                  if (wt_mean._4_4_ != veclen._4_4_) {
                    __assert_fail("d3 == n_density",
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_full_io.c"
                                  ,0x182,
                                  "int s3gaucnt_read_full(const char *, vector_t ****, vector_t *****, int32 *, float32 ****, uint32 *, uint32 *, uint32 *, uint32 **)"
                                 );
                  }
                  if (fp != (FILE *)0x0) {
                    iVar2 = bio_fread(&local_58,4,1,_has_means,has_vars,(uint32 *)((long)&ver + 4));
                    if (iVar2 != 1) {
                      s3close(_has_means);
                      return -1;
                    }
                    if (local_58 != ignore) {
                      err_msg(ERR_FATAL,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_full_io.c"
                              ,0x18e,"Checksum error; read corrupt data.\n");
                      exit(1);
                    }
                  }
                  s3close(_has_means);
                  *out_wt_var_local = wt_var;
                  *(void *****)out_pass2var_local = _maxveclen;
                  *(uint32 *)out_dnom_local = n_feat;
                  *(void ****)out_n_cb_local = _i;
                  *_sv_chksum = n_density;
                  *out_n_feat = local_90;
                  *out_n_density = veclen._4_4_;
                  *out_veclen = (uint32 *)buf;
                  pcVar3 = "";
                  if (pass2var != 0) {
                    pcVar3 = " with means";
                  }
                  pcVar4 = "";
                  if (n_cb != 0) {
                    pcVar4 = " with vars";
                  }
                  pcVar5 = "";
                  if (n_cb != 0 && n_feat != 0) {
                    pcVar5 = " (2pass)";
                  }
                  err_msg(ERR_INFO,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_full_io.c"
                          ,0x1a2,"Read %s%s%s%s [%ux%ux%u vector arrays]\n",out_wt_mean_local,pcVar3
                          ,pcVar4,pcVar5,n_density,local_90,veclen._4_4_);
                  fn_local._4_4_ = 0;
                }
              }
            }
            else {
              fn_local._4_4_ = -1;
            }
          }
          else {
            fn_local._4_4_ = -1;
          }
        }
        else {
          fn_local._4_4_ = -1;
        }
      }
      else {
        fn_local._4_4_ = -1;
      }
    }
    else {
      fn_local._4_4_ = -1;
    }
  }
  return fn_local._4_4_;
}

Assistant:

int
s3gaucnt_read_full(const char *fn,
		   vector_t ****out_wt_mean,
		   vector_t *****out_wt_var,
		   int32 *out_pass2var,
		   float32 ****out_dnom,
		   uint32 *out_n_cb,
		   uint32 *out_n_feat,
		   uint32 *out_n_density,
		   uint32 **out_veclen)
{
    uint32 rd_chksum = 0;
    uint32 sv_chksum;
    uint32 ignore;
    char *ver;
    char *do_chk;
    FILE *fp;
    uint32 swap;

    uint32 has_means;
    uint32 has_vars;
    uint32 pass2var;
    uint32 n_cb;
    uint32 n_feat;
    uint32 n_density;
    uint32 *veclen;
    float32 *buf;
    float32 ***dnom;
    uint32 n, i, b_i, j, k, l, d1, d2, d3;
    vector_t ***wt_mean = NULL;
    vector_t ****wt_var = NULL;

    fp = s3open(fn, "rb", &swap);
    if (fp == NULL)
	return S3_ERROR;

    /* check version id */
    ver = s3get_gvn_fattr("version");
    if (ver) {
	if (strcmp(ver, GAUCNT_FILE_VERSION) != 0) {
	    E_FATAL("Version mismatch for %s, file ver: %s != reader ver: %s\n",
		    fn, ver, GAUCNT_FILE_VERSION);
	}
    }
    else {
	E_FATAL("No version attribute for %s\n", fn);
    }
    
    /* if do_chk is non-NULL, there is a checksum after the data in the file */
    do_chk = s3get_gvn_fattr("chksum0");

    if (bio_fread((void *)&has_means, sizeof(uint32), 1, fp, swap, &rd_chksum) != 1) {
	return S3_ERROR;
    }

    if (bio_fread((void *)&has_vars, sizeof(uint32), 1, fp, swap, &rd_chksum) != 1) {
	return S3_ERROR;
    }

    if (bio_fread((void *)&pass2var, sizeof(uint32), 1, fp, swap, &rd_chksum) != 1) {
	return S3_ERROR;
    }

    if (bio_fread((void *)&n_cb, sizeof(uint32), 1, fp, swap, &rd_chksum) != 1) {
	return S3_ERROR;
    }

    if (bio_fread((void *)&n_density, sizeof(uint32), 1, fp, swap, &rd_chksum) != 1) {
	return S3_ERROR;
    }

    if (bio_fread_1d((void **)&veclen, sizeof(uint32), &n_feat, fp, swap, &rd_chksum) < 0) {
	return S3_ERROR;
    }

    if (has_means) {
	if (bio_fread_1d((void *)&buf, sizeof(float32), &n, fp, swap, &rd_chksum) < 0) {
	    return S3_ERROR;
	}
	
	wt_mean = (vector_t ***)ckd_calloc_3d(n_cb, n_feat, n_density, sizeof(vector_t));

	for (i = 0, b_i = 0; i < n_cb; i++) {
	    for (j = 0; j < n_feat; j++) {
		for (k = 0; k < n_density; k++) {
		    wt_mean[i][j][k] = &buf[b_i];

		    b_i += veclen[j];
		}
	    }
	}
    }

    if (has_vars) {
	uint32 blk, maxveclen;

	for (i = 0, blk = 0, maxveclen = 0; i < n_feat; i++) {
	    blk += veclen[i];
	    if (veclen[i] > maxveclen) maxveclen = veclen[i];
	}

	if (bio_fread_1d((void *)&buf, sizeof(float32), &n, fp, swap, &rd_chksum) < 0) {
	    return S3_ERROR;
	}
	assert(n == n_cb * n_density * blk * blk);
	
	wt_var = (vector_t ****)ckd_calloc_4d(n_cb, n_feat, n_density,
					      maxveclen, sizeof(vector_t));

	for (i = 0, b_i = 0; i < n_cb; i++) {
	    for (j = 0; j < n_feat; j++) {
		for (k = 0; k < n_density; k++) {
		    for (l = 0; l < veclen[j]; l++) {
			wt_var[i][j][k][l] = &buf[b_i];

			b_i += veclen[j];
		    }
		}
	    }
	}
    }

    if (bio_fread_3d((void ****)&dnom, sizeof(float32), &d1, &d2, &d3, fp, swap, &rd_chksum) < 0) {
	return S3_ERROR;
    }

    assert(d1 == n_cb);
    assert(d2 == n_feat);
    assert(d3 == n_density);

    if (do_chk) {
	/* See if the checksum in the file matches that which
	   was computed from the read data */
	
	if (bio_fread(&sv_chksum, sizeof(uint32), 1, fp, swap, &ignore) != 1) {
	    s3close(fp);
	    return S3_ERROR;
	}
	
	if (sv_chksum != rd_chksum) {
	    E_FATAL("Checksum error; read corrupt data.\n");
	}
    }
    
    s3close(fp);

    *out_wt_mean = wt_mean;
    *out_wt_var = wt_var;
    *out_pass2var = pass2var;
    *out_dnom = dnom;
    *out_n_cb = n_cb;
    *out_n_feat = n_feat;
    *out_n_density = n_density;
    *out_veclen = veclen;

    E_INFO("Read %s%s%s%s [%ux%ux%u vector arrays]\n",
	   fn,
	   (has_means ? " with means" : ""),
	   (has_vars ? " with vars" : ""),
	   (has_vars && pass2var ? " (2pass)" : ""),
	   n_cb, n_feat, n_density);

    return S3_SUCCESS;
}